

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::VectorRasterizerTests::HorizontalLinesDoesNothing(VectorRasterizerTests *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  cells_container *pcVar5;
  allocator local_139;
  string local_138 [32];
  LocationInfo local_118;
  allocator local_e9;
  string local_e8 [32];
  LocationInfo local_c8;
  undefined1 local_a0 [8];
  cell reference [1];
  undefined1 local_88 [8];
  vector_rasterizer vr;
  VectorRasterizerTests *this_local;
  
  vr._112_8_ = this;
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_88);
  iVar1 = anon_unknown_5::fp(10.0);
  iVar2 = anon_unknown_5::fp(15.5);
  iVar3 = anon_unknown_5::fp(70.0);
  iVar4 = anon_unknown_5::fp(15.5);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  reference[0].x = 0;
  local_a0._0_2_ = 0;
  local_a0._2_2_ = 0;
  local_a0._4_4_ = 0;
  pcVar5 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_e9);
  ut::LocationInfo::LocationInfo(&local_c8,(string *)local_e8,0xa3);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])local_a0,pcVar5,&local_c8);
  ut::LocationInfo::~LocationInfo(&local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  iVar1 = anon_unknown_5::fp(10.0);
  iVar2 = anon_unknown_5::fp(13.5);
  iVar3 = anon_unknown_5::fp(70.0);
  iVar4 = anon_unknown_5::fp(13.5);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  iVar1 = anon_unknown_5::fp(11.3);
  iVar2 = anon_unknown_5::fp(-17.5);
  iVar3 = anon_unknown_5::fp(29.0);
  iVar4 = anon_unknown_5::fp(-17.5);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  iVar1 = anon_unknown_5::fp(-10.0);
  iVar2 = anon_unknown_5::fp(215.5);
  iVar3 = anon_unknown_5::fp(-70.0);
  iVar4 = anon_unknown_5::fp(215.5);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  pcVar5 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_138,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_139);
  ut::LocationInfo::LocationInfo(&local_118,(string *)local_138,0xab);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])local_a0,pcVar5,&local_118);
  ut::LocationInfo::~LocationInfo(&local_118);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_88);
  return;
}

Assistant:

test( HorizontalLinesDoesNothing )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				vr.line(fp(10.0), fp(15.5), fp(70.0), fp(15.5));

				// ASSERT
				const vector_rasterizer::cell reference[] = {
					{ },
				};

				assert_equal(reference, vr.cells());

				// ACT
				vr.line(fp(10.0), fp(13.5), fp(70.0), fp(13.5));
				vr.line(fp(11.3), fp(-17.5), fp(29.0), fp(-17.5));
				vr.line(fp(-10.0), fp(215.5), fp(-70.0), fp(215.5));

				// ASSERT
				assert_equal(reference, vr.cells());
			}